

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-gvec-desc.h
# Opt level: O2

void helper_gvec_sdot_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t i;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 4) {
    *(int *)((long)vd + uVar2) =
         (int)*(char *)((long)vm + uVar2 + 2) * (int)*(char *)((long)vn + uVar2 + 2) +
         (int)*(char *)((long)vm + uVar2 + 1) * (int)*(char *)((long)vn + uVar2 + 1) +
         (int)*(char *)((long)vm + uVar2) * (int)*(char *)((long)vn + uVar2) +
         *(int *)((long)vd + uVar2) +
         (int)*(char *)((long)vm + uVar2 + 3) * (int)*(char *)((long)vn + uVar2 + 3);
  }
  for (; uVar1 < (desc >> 2 & 0xf8) + 8; uVar1 = uVar1 + 8) {
    *(undefined8 *)((long)vd + uVar1) = 0;
  }
  return;
}

Assistant:

static inline intptr_t simd_oprsz(uint32_t desc)
{
    return (extract32(desc, SIMD_OPRSZ_SHIFT, SIMD_OPRSZ_BITS) + 1) * 8;
}